

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

FunctionData * __thiscall
ExpressionContext::GetFunctionOwner(ExpressionContext *this,ScopeData *scopeData)

{
  long lVar1;
  long lVar2;
  FunctionData *function;
  ScopeData *curr;
  ScopeData *scopeData_local;
  ExpressionContext *this_local;
  
  function = (FunctionData *)scopeData;
  if (scopeData->type != SCOPE_TEMPORARY) {
    for (; function != (FunctionData *)0x0; function = (FunctionData *)function->source) {
      lVar1._0_1_ = function->coroutine;
      lVar1._1_1_ = function->accessor;
      lVar1._2_1_ = function->isOperator;
      lVar1._3_5_ = *(undefined5 *)&function->field_0x23;
      if (lVar1 != 0) {
        return (FunctionData *)0x0;
      }
      lVar2._0_1_ = function->isInternal;
      lVar2._1_1_ = function->isHidden;
      lVar2._2_2_ = *(undefined2 *)&function->field_0x12;
      lVar2._4_4_ = function->attributes;
      if (lVar2 != 0) {
        return (FunctionData *)0x0;
      }
      if ((FunctionData *)function->scope != (FunctionData *)0x0) {
        return (FunctionData *)function->scope;
      }
    }
  }
  return (FunctionData *)0x0;
}

Assistant:

FunctionData* ExpressionContext::GetFunctionOwner(ScopeData *scopeData)
{
	// Temporary scopes have no owner
	if(scopeData->type == SCOPE_TEMPORARY)
		return NULL;

	// Walk up, but if we reach a type or namespace owner, stop - we're not in a context of a function
	for(ScopeData *curr = scopeData; curr; curr = curr->scope)
	{
		if(curr->ownerType)
			return NULL;

		if(curr->ownerNamespace)
			return NULL;

		if(FunctionData *function = curr->ownerFunction)
			return function;
	}

	return NULL;
}